

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

void Style::extractConditionalConstraint(TempConstraintData *tempConstraint,xml_node<char> *node)

{
  xml_node<char> *pxVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  logic_error *plVar5;
  reference pvVar6;
  xml_attribute<char> *this;
  char *name;
  string local_100;
  u16string local_e0;
  xml_node<char> *local_c0;
  xml_node<char> *field;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  fields;
  Quant quant;
  string attrVal;
  xml_node<char> *child;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  local_68;
  Quant local_50;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  local_48;
  reference local_30;
  ConditionalConstraint *conditional;
  xml_node<char> *local_18;
  xml_node<char> *node_local;
  TempConstraintData *tempConstraint_local;
  
  local_18 = node;
  node_local = (xml_node<char> *)tempConstraint;
  pcVar4 = rapidxml::xml_base<char>::name(&node->super_xml_base<char>);
  iVar3 = strcmp(pcVar4,"bcf:constraint");
  if (iVar3 != 0) {
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar5,"Unexpected node name");
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pxVar1 = node_local + 1;
  child._0_4_ = 0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::vector(&local_68);
  local_50 = All;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::vector(&local_48);
  pvVar6 = std::vector<Style::ConditionalConstraint,_std::allocator<Style::ConditionalConstraint>_>
           ::emplace_back<Style::ConditionalConstraint>
                     ((vector<Style::ConditionalConstraint,_std::allocator<Style::ConditionalConstraint>_>
                       *)&pxVar1->m_first_attribute,(ConditionalConstraint *)&child);
  ConditionalConstraint::~ConditionalConstraint((ConditionalConstraint *)&child);
  local_30 = pvVar6;
  attrVal.field_2._8_8_ = rapidxml::xml_node<char>::first_node(local_18,(char *)0x0,0,true);
  do {
    if (attrVal.field_2._8_8_ == 0) {
      return;
    }
    this = rapidxml::xml_node<char>::first_attribute
                     ((xml_node<char> *)attrVal.field_2._8_8_,(char *)0x0,0,true);
    pcVar4 = rapidxml::xml_base<char>::value(&this->super_xml_base<char>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&quant,pcVar4,
               (allocator<char> *)
               ((long)&fields.
                       super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fields.
                       super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &quant,"all");
    if (bVar2) {
      fields.
      super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = All;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &quant,"one");
      if (bVar2) {
        fields.
        super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = One;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&quant,"none");
        if (!bVar2) {
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar5,"Unexpected result");
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        fields.
        super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = None;
      }
    }
    field = (xml_node<char> *)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)&field);
    for (local_c0 = rapidxml::xml_node<char>::first_node
                              ((xml_node<char> *)attrVal.field_2._8_8_,(char *)0x0,0,true);
        local_c0 != (xml_node<char> *)0x0;
        local_c0 = rapidxml::xml_node<char>::next_sibling(local_c0,(char *)0x0,0,true)) {
      pcVar4 = rapidxml::xml_base<char>::value(&local_c0->super_xml_base<char>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,pcVar4,(allocator<char> *)((long)&name + 7));
      UtfHandler::utf8to16(&local_e0,(UtfHandler *)(anonymous_namespace)::utf,&local_100);
      std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
      emplace_back<std::__cxx11::u16string>
                ((vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)&field,
                 &local_e0);
      std::__cxx11::u16string::~u16string((u16string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)((long)&name + 7));
    }
    pcVar4 = rapidxml::xml_base<char>::name((xml_base<char> *)attrVal.field_2._8_8_);
    iVar3 = strcmp(pcVar4 + 4,"antecedent");
    if (iVar3 == 0) {
      (local_30->pre).condition =
           (Quant)fields.
                  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::operator=(&(local_30->pre).fields,
                  (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                   *)&field);
    }
    else {
      (local_30->post).condition =
           (Quant)fields.
                  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::operator=(&(local_30->post).fields,
                  (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                   *)&field);
    }
    std::
    vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
               *)&field);
    std::__cxx11::string::~string((string *)&quant);
    attrVal.field_2._8_8_ =
         (size_type)rapidxml::xml_node<char>::next_sibling(attrVal.field_2._8_8_,(char *)0x0,0,true)
    ;
  } while( true );
}

Assistant:

void extractConditionalConstraint (TempConstraintData &tempConstraint, xml_node<> *node) {
    EXPECT_NAME(node, "bcf:constraint");
    ConditionalConstraint &conditional = tempConstraint.conditional.emplace_back(ConditionalConstraint {});

    for (xml_node<> *child = node->first_node(); child; child = child->next_sibling()) {
        string attrVal = child->first_attribute()->value(); // TODO: Check and don't segfault on this

        ConditionalConstraint::Quant quant;

        if (attrVal == "all") {
            quant = ConditionalConstraint::Quant::All;
        } else if (attrVal == "one") {
            quant = ConditionalConstraint::Quant::One;
        } else {
            ASSERT(attrVal == "none");
            quant = ConditionalConstraint::Quant::None;
        }

        vector<u16string> fields {};

        for (xml_node<> *field = child->first_node(); field; field = field->next_sibling()) {
            fields.emplace_back(utf.utf8to16(field->value()));
        }

        const char *name = child->name();
        if (IS("antecedent")) {
            conditional.pre.condition = quant;
            conditional.pre.fields = fields;
        } else {
            conditional.post.condition = quant;
            conditional.post.fields = fields;
        }
    }
}